

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusmenuregistrarproxy_p.cpp
# Opt level: O3

void QDBusMenuRegistrarInterface::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int iVar1;
  QDBusPendingCall *pQVar2;
  QDBusError *this;
  undefined8 *puVar3;
  QDBusReply<QString> *this_00;
  long in_FS_OFFSET;
  QDBusPendingReply<QString,_QDBusObjectPath> _r;
  QDBusPendingReply<> _r_1;
  undefined1 local_70 [16];
  InterfaceType *pIStack_60;
  char16_t *local_58;
  Data *pDStack_50;
  QArrayData *local_48;
  char16_t *pcStack_40;
  undefined1 *local_38;
  Data *pDStack_30;
  QArrayData *local_28;
  char16_t *pcStack_20;
  undefined1 *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 2) {
      puVar3 = (undefined8 *)*_a;
      if (*_a[1] == 1) {
        *puVar3 = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusObjectPath>::metaType;
        goto switchD_006353eb_default;
      }
    }
    else {
      puVar3 = (undefined8 *)*_a;
    }
    *puVar3 = 0;
    goto switchD_006353eb_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_006353eb_default;
  switch(_id) {
  case 0:
    local_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    GetMenuForWindow((QDBusPendingReply<QString,_QDBusObjectPath> *)local_70,
                     (QDBusMenuRegistrarInterface *)_o,*_a[1]);
    pQVar2 = (QDBusPendingCall *)*_a;
    if ((pQVar2 != (QDBusPendingCall *)0x0) &&
       (QDBusPendingReplyBase::assign(pQVar2), *(long *)pQVar2 != 0)) {
      local_70._8_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      pIStack_60 = &QtPrivate::QMetaTypeInterfaceWrapper<QDBusObjectPath>::metaType;
      QDBusPendingReplyBase::setMetaTypes((int)pQVar2,(QMetaType *)0x2);
    }
    this_00 = (QDBusReply<QString> *)local_70;
    goto LAB_006354f8;
  case 1:
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_20 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    pDStack_30 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_40 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pDStack_50 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_70._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pIStack_60 = (InterfaceType *)&DAT_aaaaaaaaaaaaaaaa;
    GetMenuForWindow((QDBusReply<QString> *)(local_70 + 8),(QDBusMenuRegistrarInterface *)_o,*_a[1],
                     (QDBusObjectPath *)_a[2]);
    this = (QDBusError *)*_a;
    if (this != (QDBusError *)0x0) {
      QDBusError::operator=(this,(QDBusError *)(local_70 + 8));
      QString::operator=((QString *)(this + 1),(QString *)&local_28);
    }
    if (local_28 != (QArrayData *)0x0) {
      LOCK();
      (local_28->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_28,2,0x10);
      }
    }
    if (local_48 != (QArrayData *)0x0) {
      LOCK();
      (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_48,2,0x10);
      }
    }
    if (pIStack_60 != (InterfaceType *)0x0) {
      LOCK();
      *(int *)&pIStack_60->revision = *(int *)&pIStack_60->revision + -1;
      iVar1._0_2_ = pIStack_60->revision;
      iVar1._2_2_ = pIStack_60->alignment;
      UNLOCK();
      if (iVar1 == 0) {
        QArrayData::deallocate((QArrayData *)pIStack_60,2,0x10);
      }
    }
    goto switchD_006353eb_default;
  case 2:
    local_70._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    RegisterWindow((QDBusPendingReply<> *)(local_70 + 8),(QDBusMenuRegistrarInterface *)_o,*_a[1],
                   (QDBusObjectPath *)_a[2]);
    break;
  case 3:
    local_70._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    UnregisterWindow((QDBusPendingReply<> *)(local_70 + 8),(QDBusMenuRegistrarInterface *)_o,*_a[1])
    ;
    break;
  default:
    goto switchD_006353eb_default;
  }
  pQVar2 = (QDBusPendingCall *)*_a;
  if ((pQVar2 != (QDBusPendingCall *)0x0) &&
     (QDBusPendingReplyBase::assign(pQVar2), *(long *)pQVar2 != 0)) {
    QDBusPendingReplyBase::setMetaTypes((int)pQVar2,(QMetaType *)0x0);
  }
  this_00 = (QDBusReply<QString> *)(local_70 + 8);
LAB_006354f8:
  QDBusPendingReplyBase::~QDBusPendingReplyBase((QDBusPendingReplyBase *)this_00);
switchD_006353eb_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDBusMenuRegistrarInterface::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDBusMenuRegistrarInterface *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: { QDBusPendingReply<QString,QDBusObjectPath> _r = _t->GetMenuForWindow((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QString,QDBusObjectPath>*>(_a[0]) = std::move(_r); }  break;
        case 1: { QDBusReply<QString> _r = _t->GetMenuForWindow((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDBusObjectPath&>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QDBusReply<QString>*>(_a[0]) = std::move(_r); }  break;
        case 2: { QDBusPendingReply<> _r = _t->RegisterWindow((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QDBusObjectPath>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        case 3: { QDBusPendingReply<> _r = _t->UnregisterWindow((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QDBusObjectPath >(); break;
            }
            break;
        }
    }
}